

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerGLSL::legacy_tex_op
          (string *__return_storage_ptr__,CompilerGLSL *this,string *op,SPIRType *imgtype,
          uint32_t tex)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  SPIREntryPoint *pSVar6;
  runtime_error *prVar7;
  SPIRType *pSVar8;
  string *psVar9;
  byte bVar10;
  char *pcVar11;
  uint32_t uVar12;
  undefined4 in_register_00000084;
  char *type;
  string type_prefix;
  undefined1 local_80 [8];
  string local_78;
  string *local_58;
  string local_50;
  
  pSVar8 = (SPIRType *)&switchD_001f1d15::switchdataD_0033be80;
  switch((imgtype->image).dim) {
  case Dim1D:
    if ((this->options).es == true) goto switchD_001f1d15_caseD_6;
    local_80 = (undefined1  [8])0x33fce1;
    pSVar8 = (SPIRType *)local_80;
    if ((imgtype->image).arrayed != false) {
      local_80 = (undefined1  [8])0x33fcea;
      pSVar8 = (SPIRType *)local_80;
    }
    break;
  case Dim2D:
    pcVar11 = "iimage2DArray";
    if (((this->options).es & 1U) != 0) {
      pcVar11 = "iimage2D";
    }
    local_80 = (undefined1  [8])(pcVar11 + 6);
    pSVar8 = (SPIRType *)local_80;
    if ((imgtype->image).arrayed == false) {
      local_80 = (undefined1  [8])0x33fcf8;
      pSVar8 = (SPIRType *)local_80;
    }
    break;
  case Dim3D:
    local_80 = (undefined1  [8])0x33fd37;
    break;
  case DimCube:
    local_80 = (undefined1  [8])0x33fd4d;
    break;
  case DimRect:
    local_80 = (undefined1  [8])0x33fd2a;
    break;
  case DimBuffer:
    local_80 = (undefined1  [8])0x347175;
    break;
  case DimSubpassData:
switchD_001f1d15_caseD_6:
    local_80 = (undefined1  [8])0x33fcf8;
    break;
  default:
    local_80 = (undefined1  [8])0x33bad0;
    pSVar8 = imgtype;
  }
  uVar12 = tex;
  local_58 = __return_storage_ptr__;
  pSVar6 = Compiler::get_entry_point(&this->super_Compiler);
  iVar4 = ::std::__cxx11::string::compare((char *)op);
  if ((iVar4 == 0) || (iVar4 = ::std::__cxx11::string::compare((char *)op), iVar4 == 0)) {
LAB_001f1e04:
    bVar2 = (this->options).es;
    uVar5 = (this->options).version;
    pSVar8 = (SPIRType *)(ulong)uVar5;
    if ((uVar5 < 300 & bVar2) == 1) {
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_80 + 8),"GL_EXT_shader_texture_lod","");
      require_extension_internal(this,(string *)(local_80 + 8));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      bVar2 = true;
      goto LAB_001f1eaf;
    }
    pSVar8 = (SPIRType *)(ulong)CONCAT31((int3)(uVar5 >> 8),0x81 < uVar5);
    if (bVar2 == false && 0x81 >= uVar5) {
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_80 + 8),"GL_ARB_shader_texture_lod","");
      require_extension_internal(this,(string *)(local_80 + 8));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
    }
  }
  else {
    iVar4 = ::std::__cxx11::string::compare((char *)op);
    if (iVar4 != 0) {
      iVar4 = ::std::__cxx11::string::compare((char *)op);
      bVar2 = false;
      if ((iVar4 != 0) || (bVar2 = false, pSVar6->model == ExecutionModelVertex)) goto LAB_001f1eaf;
      goto LAB_001f1e04;
    }
    if (pSVar6->model != ExecutionModelVertex) goto LAB_001f1e04;
  }
  bVar2 = false;
LAB_001f1eaf:
  iVar4 = ::std::__cxx11::string::compare((char *)op);
  if ((iVar4 == 0) || (iVar4 = ::std::__cxx11::string::compare((char *)op), iVar4 == 0)) {
    if (((this->options).es == true) && ((this->options).version < 300)) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      join<std::__cxx11::string_const&,char_const(&)[26]>
                ((string *)(local_80 + 8),(spirv_cross *)op,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 " not allowed in legacy ES",(char (*) [26])pSVar8);
      ::std::runtime_error::runtime_error(prVar7,(string *)(local_80 + 8));
      *(undefined ***)prVar7 = &PTR__runtime_error_003d4e98;
      __cxa_throw(prVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)(local_80 + 8),"GL_EXT_gpu_shader4","");
    require_extension_internal(this,(string *)(local_80 + 8));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
  }
  bVar3 = Compiler::is_depth_image(&this->super_Compiler,imgtype,tex);
  if (((bVar3) && ((this->options).es == true)) && ((this->options).version < 300)) {
    iVar4 = ::std::__cxx11::string::compare((char *)op);
    if ((iVar4 != 0) && (iVar4 = ::std::__cxx11::string::compare((char *)op), iVar4 != 0)) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      join<std::__cxx11::string_const&,char_const(&)[44]>
                ((string *)(local_80 + 8),(spirv_cross *)op,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 " not allowed on depth samplers in legacy ES",(char (*) [44])pSVar8);
      ::std::runtime_error::runtime_error(prVar7,(string *)(local_80 + 8));
      *(undefined ***)prVar7 = &PTR__runtime_error_003d4e98;
      __cxa_throw(prVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)(local_80 + 8),"GL_EXT_shadow_samplers","");
    require_extension_internal(this,(string *)(local_80 + 8));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
  }
  iVar4 = ::std::__cxx11::string::compare((char *)op);
  if (iVar4 == 0) {
    if (((this->options).es == true) && ((this->options).version < 300)) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_80 + 8),"textureSize not supported in legacy ES","");
      ::std::runtime_error::runtime_error(prVar7,(string *)(local_80 + 8));
      *(undefined ***)prVar7 = &PTR__runtime_error_003d4e98;
      __cxa_throw(prVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (bVar3) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_80 + 8),
                 "textureSize not supported on shadow sampler in legacy GLSL","");
      ::std::runtime_error::runtime_error(prVar7,(string *)(local_80 + 8));
      *(undefined ***)prVar7 = &PTR__runtime_error_003d4e98;
      __cxa_throw(prVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)(local_80 + 8),"GL_EXT_gpu_shader4","");
    require_extension_internal(this,(string *)(local_80 + 8));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
  }
  iVar4 = ::std::__cxx11::string::compare((char *)op);
  bVar1 = (this->options).es;
  if (iVar4 == 0) {
    uVar5 = (this->options).version;
    bVar10 = uVar5 < 300 & bVar1;
    pSVar8 = (SPIRType *)CONCAT71((int7)((ulong)pSVar8 >> 8),bVar10);
    if (bVar10 == 1) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_80 + 8),"texelFetch not supported in legacy ES","");
      ::std::runtime_error::runtime_error(prVar7,(string *)(local_80 + 8));
      *(undefined ***)prVar7 = &PTR__runtime_error_003d4e98;
      __cxa_throw(prVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  else {
    uVar5 = (this->options).version;
  }
  pcVar11 = "texture";
  if (bVar3) {
    pcVar11 = "shadow";
  }
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_80 + 8),pcVar11,pcVar11 + ((ulong)bVar3 ^ 7));
  bVar10 = bVar3 & bVar1 & uVar5 < 300;
  iVar4 = ::std::__cxx11::string::compare((char *)op);
  psVar9 = local_58;
  if (iVar4 == 0) {
    if (bVar10 == 0) {
      join<std::__cxx11::string&,char_const*&>
                (local_58,(spirv_cross *)(local_80 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                 (char **)pSVar8);
    }
    else {
      join<std::__cxx11::string&,char_const*&,char_const(&)[4]>
                (local_58,(spirv_cross *)(local_80 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                 (char **)0x342eb3,(char (*) [4])CONCAT44(in_register_00000084,uVar12));
    }
  }
  else {
    iVar4 = ::std::__cxx11::string::compare((char *)op);
    psVar9 = local_58;
    if (iVar4 == 0) {
      local_50._M_dataplus._M_p = "Lod";
      if (bVar2) {
        local_50._M_dataplus._M_p = "LodEXT";
      }
      join<std::__cxx11::string&,char_const*&,char_const*>
                (local_58,(spirv_cross *)(local_80 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                 (char **)&local_50,(char **)CONCAT44(in_register_00000084,uVar12));
    }
    else {
      iVar4 = ::std::__cxx11::string::compare((char *)op);
      psVar9 = local_58;
      if (iVar4 == 0) {
        local_50._M_dataplus._M_p = "Proj";
        if (bVar10 != 0) {
          local_50._M_dataplus._M_p = "ProjEXT";
        }
        join<std::__cxx11::string&,char_const*&,char_const*>
                  (local_58,(spirv_cross *)(local_80 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                   (char **)&local_50,(char **)CONCAT44(in_register_00000084,uVar12));
      }
      else {
        iVar4 = ::std::__cxx11::string::compare((char *)op);
        psVar9 = local_58;
        if (iVar4 == 0) {
          uVar5 = (this->options).version;
          pcVar11 = "GradARB";
          if (0x81 < uVar5) {
            pcVar11 = "Grad";
          }
          bVar2 = (this->options).es;
          if (bVar2 != false) {
            pcVar11 = "Grad";
          }
          local_50._M_dataplus._M_p = "GradEXT";
          if (299 < uVar5) {
            local_50._M_dataplus._M_p = pcVar11;
          }
          if (bVar2 == false) {
            local_50._M_dataplus._M_p = pcVar11;
          }
          join<std::__cxx11::string&,char_const*&,char_const*>
                    (local_58,(spirv_cross *)(local_80 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                     (char **)&local_50,(char **)CONCAT44(in_register_00000084,uVar12));
        }
        else {
          iVar4 = ::std::__cxx11::string::compare((char *)op);
          psVar9 = local_58;
          if (iVar4 == 0) {
            local_50._M_dataplus._M_p = "ProjLod";
            if (bVar2) {
              local_50._M_dataplus._M_p = "ProjLodEXT";
            }
            join<std::__cxx11::string&,char_const*&,char_const*>
                      (local_58,(spirv_cross *)(local_80 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80
                       ,(char **)&local_50,(char **)CONCAT44(in_register_00000084,uVar12));
          }
          else {
            iVar4 = ::std::__cxx11::string::compare((char *)op);
            psVar9 = local_58;
            if (iVar4 == 0) {
              join<std::__cxx11::string&,char_const*&,char_const(&)[10]>
                        (local_58,(spirv_cross *)(local_80 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_80,(char **)0x33f9f1,
                         (char (*) [10])CONCAT44(in_register_00000084,uVar12));
            }
            else {
              iVar4 = ::std::__cxx11::string::compare((char *)op);
              psVar9 = local_58;
              if (iVar4 == 0) {
                uVar5 = (this->options).version;
                pcVar11 = "ProjGradARB";
                if (0x81 < uVar5) {
                  pcVar11 = "ProjGrad";
                }
                bVar2 = (this->options).es;
                if (bVar2 != false) {
                  pcVar11 = "ProjGrad";
                }
                local_50._M_dataplus._M_p = "ProjGradEXT";
                if (299 < uVar5) {
                  local_50._M_dataplus._M_p = pcVar11;
                }
                if (bVar2 == false) {
                  local_50._M_dataplus._M_p = pcVar11;
                }
                join<std::__cxx11::string&,char_const*&,char_const*>
                          (local_58,(spirv_cross *)(local_80 + 8),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_80,(char **)&local_50,
                           (char **)CONCAT44(in_register_00000084,uVar12));
              }
              else {
                iVar4 = ::std::__cxx11::string::compare((char *)op);
                psVar9 = local_58;
                if (iVar4 == 0) {
                  join<std::__cxx11::string&,char_const*&,char_const(&)[14]>
                            (local_58,(spirv_cross *)(local_80 + 8),
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_80,(char **)0x33fa51,
                             (char (*) [14])CONCAT44(in_register_00000084,uVar12));
                }
                else {
                  iVar4 = ::std::__cxx11::string::compare((char *)op);
                  psVar9 = local_58;
                  if (iVar4 == 0) {
                    join<char_const(&)[12],char_const*&>
                              (local_58,(spirv_cross *)"textureSize",(char (*) [12])local_80,
                               (char **)pSVar8);
                  }
                  else {
                    iVar4 = ::std::__cxx11::string::compare((char *)op);
                    psVar9 = local_58;
                    if (iVar4 != 0) {
                      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
                      join<char_const(&)[32],std::__cxx11::string_const&>
                                (&local_50,(spirv_cross *)"Unsupported legacy texture op: ",
                                 (char (*) [32])op,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)pSVar8);
                      ::std::runtime_error::runtime_error(prVar7,(string *)&local_50);
                      *(undefined ***)prVar7 = &PTR__runtime_error_003d4e98;
                      __cxa_throw(prVar7,&CompilerError::typeinfo,
                                  ::std::runtime_error::~runtime_error);
                    }
                    join<char_const(&)[11],char_const*&>
                              (local_58,(spirv_cross *)"texelFetch",(char (*) [11])local_80,
                               (char **)pSVar8);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  return psVar9;
}

Assistant:

string CompilerGLSL::legacy_tex_op(const std::string &op, const SPIRType &imgtype, uint32_t tex)
{
	const char *type;
	switch (imgtype.image.dim)
	{
	case spv::Dim1D:
		// Force 2D path for ES.
		if (options.es)
			type = (imgtype.image.arrayed && !options.es) ? "2DArray" : "2D";
		else
			type = (imgtype.image.arrayed && !options.es) ? "1DArray" : "1D";
		break;
	case spv::Dim2D:
		type = (imgtype.image.arrayed && !options.es) ? "2DArray" : "2D";
		break;
	case spv::Dim3D:
		type = "3D";
		break;
	case spv::DimCube:
		type = "Cube";
		break;
	case spv::DimRect:
		type = "2DRect";
		break;
	case spv::DimBuffer:
		type = "Buffer";
		break;
	case spv::DimSubpassData:
		type = "2D";
		break;
	default:
		type = "";
		break;
	}

	// In legacy GLSL, an extension is required for textureLod in the fragment
	// shader or textureGrad anywhere.
	bool legacy_lod_ext = false;
	auto &execution = get_entry_point();
	if (op == "textureGrad" || op == "textureProjGrad" ||
	    ((op == "textureLod" || op == "textureProjLod") && execution.model != ExecutionModelVertex))
	{
		if (is_legacy_es())
		{
			legacy_lod_ext = true;
			require_extension_internal("GL_EXT_shader_texture_lod");
		}
		else if (is_legacy_desktop())
			require_extension_internal("GL_ARB_shader_texture_lod");
	}

	if (op == "textureLodOffset" || op == "textureProjLodOffset")
	{
		if (is_legacy_es())
			SPIRV_CROSS_THROW(join(op, " not allowed in legacy ES"));

		require_extension_internal("GL_EXT_gpu_shader4");
	}

	// GLES has very limited support for shadow samplers.
	// Basically shadow2D and shadow2DProj work through EXT_shadow_samplers,
	// everything else can just throw
	bool is_comparison = is_depth_image(imgtype, tex);
	if (is_comparison && is_legacy_es())
	{
		if (op == "texture" || op == "textureProj")
			require_extension_internal("GL_EXT_shadow_samplers");
		else
			SPIRV_CROSS_THROW(join(op, " not allowed on depth samplers in legacy ES"));
	}

	if (op == "textureSize")
	{
		if (is_legacy_es())
			SPIRV_CROSS_THROW("textureSize not supported in legacy ES");
		if (is_comparison)
			SPIRV_CROSS_THROW("textureSize not supported on shadow sampler in legacy GLSL");
		require_extension_internal("GL_EXT_gpu_shader4");
	}

	if (op == "texelFetch" && is_legacy_es())
		SPIRV_CROSS_THROW("texelFetch not supported in legacy ES");

	bool is_es_and_depth = is_legacy_es() && is_comparison;
	std::string type_prefix = is_comparison ? "shadow" : "texture";

	if (op == "texture")
		return is_es_and_depth ? join(type_prefix, type, "EXT") : join(type_prefix, type);
	else if (op == "textureLod")
		return join(type_prefix, type, legacy_lod_ext ? "LodEXT" : "Lod");
	else if (op == "textureProj")
		return join(type_prefix, type, is_es_and_depth ? "ProjEXT" : "Proj");
	else if (op == "textureGrad")
		return join(type_prefix, type, is_legacy_es() ? "GradEXT" : is_legacy_desktop() ? "GradARB" : "Grad");
	else if (op == "textureProjLod")
		return join(type_prefix, type, legacy_lod_ext ? "ProjLodEXT" : "ProjLod");
	else if (op == "textureLodOffset")
		return join(type_prefix, type, "LodOffset");
	else if (op == "textureProjGrad")
		return join(type_prefix, type,
		            is_legacy_es() ? "ProjGradEXT" : is_legacy_desktop() ? "ProjGradARB" : "ProjGrad");
	else if (op == "textureProjLodOffset")
		return join(type_prefix, type, "ProjLodOffset");
	else if (op == "textureSize")
		return join("textureSize", type);
	else if (op == "texelFetch")
		return join("texelFetch", type);
	else
	{
		SPIRV_CROSS_THROW(join("Unsupported legacy texture op: ", op));
	}
}